

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::binaryByComponent<double,_double,_double>::call
          (binaryByComponent<double,_double,_double> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  uint uVar2;
  GLuint GVar3;
  _variable_type _Var4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  GLuint component;
  ulong uVar9;
  undefined8 uVar10;
  
  GVar3 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  _Var4 = (*(this->super_binaryBase).super_functionObject._vptr_functionObject[4])(this,0);
  uVar5 = Utils::getNumberOfComponentsForVariableType(_Var4);
  _Var4 = (*(this->super_binaryBase).super_functionObject._vptr_functionObject[4])(this,1);
  uVar6 = Utils::getNumberOfComponentsForVariableType(_Var4);
  uVar2 = uVar6;
  if (uVar6 < uVar5) {
    uVar2 = uVar5;
  }
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  uVar9 = 0;
  do {
    uVar7 = uVar9;
    if (uVar5 == 1) {
      uVar7 = 0;
    }
    uVar8 = uVar9;
    if (uVar6 == 1) {
      uVar8 = 0;
    }
    uVar10 = (*pcVar1)(*(undefined8 *)((long)argument_src + uVar7 * 8),
                       *(undefined8 *)((long)argument_src + uVar8 * 8 + (ulong)GVar3));
    *(undefined8 *)((long)result_dst + uVar9 * 8) = uVar10;
    uVar9 = uVar9 + 1;
  } while (uVar2 != uVar9);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT*  p_result = (ResT*)result_dst;
		Arg1T* p_arg_1  = (Arg1T*)argument_src;
		Arg2T* p_arg_2  = (Arg2T*)((glw::GLubyte*)argument_src + getArgumentOffset(1));

		const glw::GLuint n_components_0 = getArgumentComponents(0);
		const glw::GLuint n_components_1 = getArgumentComponents(1);
		const glw::GLuint n_components   = de::max(n_components_0, n_components_1);

		const glw::GLuint component_step_0 = (1 == n_components_0) ? 0 : 1;
		const glw::GLuint component_step_1 = (1 == n_components_1) ? 0 : 1;

		functionPointer p_function = (functionPointer)m_p_function;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const Arg1T first_arg  = p_arg_1[component * component_step_0];
			const Arg2T second_arg = p_arg_2[component * component_step_1];

			p_result[component] = p_function(first_arg, second_arg);
		}
	}